

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageImage::prepare
          (RenderVertexStorageImage *this,PrepareRenderPassContext *context)

{
  pointer pcVar1;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar3;
  Context *pCVar4;
  DeviceInterface *deviceInterface;
  VkDevice device;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var5;
  VkDescriptorPool obj;
  deUint64 dVar6;
  DeviceInterface *pDVar7;
  VkImageView obj_00;
  Handle<(vk::HandleType)21> HVar8;
  VkDevice pVVar9;
  VkAllocationCallbacks *pVVar10;
  Handle<(vk::HandleType)13> HVar11;
  const_iterator cVar12;
  VkDescriptorImageInfo imageInfo;
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorPoolSize poolSizes;
  VkDescriptorSetLayoutBinding binding;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorSetLayout layout;
  Move<vk::Handle<(vk::HandleType)21>_> local_158;
  undefined1 local_138 [24];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  VkDescriptorSetLayout *local_118;
  Move<vk::Handle<(vk::HandleType)13>_> local_108;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  VkImage VStack_d0;
  VkDescriptorPoolSize *local_c8;
  Move<vk::Handle<(vk::HandleType)21>_> *local_c0;
  undefined8 local_b8;
  VkImageSubresourceRange VStack_b0;
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  *local_98;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  *pvStack_90;
  long local_88;
  VkRenderPass local_80;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  VkShaderModule local_58;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_50;
  VkDescriptorSetLayout local_38;
  
  local_80.m_internal = (context->m_renderPass).m_internal;
  pCVar4 = context->m_context->m_context;
  deviceInterface = pCVar4->m_vkd;
  device = pCVar4->m_device;
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)pCVar4->m_binaryCollection;
  pcVar1 = local_138 + 0x10;
  local_138._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"storage-image.vert","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_138);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_e8,deviceInterface,device,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  DStack_50.m_device = local_d8;
  DStack_50.m_allocator = (VkAllocationCallbacks *)VStack_d0.m_internal;
  local_58.m_internal = local_e8._0_8_;
  DStack_50.m_deviceIface = (DeviceInterface *)local_e8._8_8_;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)0x0;
  VStack_d0.m_internal = 0;
  if ((pointer)local_138._0_8_ != pcVar1) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  p_Var5 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_context->m_context->m_binaryCollection;
  local_138._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"render-white.frag","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var5,(key_type *)local_138);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_e8,deviceInterface,device,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  DStack_70.m_device = local_d8;
  DStack_70.m_allocator = (VkAllocationCallbacks *)VStack_d0.m_internal;
  local_78.m_internal = local_e8._0_8_;
  DStack_70.m_deviceIface = (DeviceInterface *)local_e8._8_8_;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)0x0;
  VStack_d0.m_internal = 0;
  if ((pointer)local_138._0_8_ != pcVar1) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  local_98 = (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)0x0;
  pvStack_90 = (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                *)0x0;
  local_88 = 0;
  local_d8 = (VkDevice)0x0;
  local_e8._0_8_ = 0x300000000;
  local_e8._8_8_ = (DeviceInterface *)0x100000001;
  std::vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>::
  _M_realloc_insert<vk::VkDescriptorSetLayoutBinding_const&>
            ((vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>
              *)&local_98,(iterator)0x0,(VkDescriptorSetLayoutBinding *)local_e8);
  local_d8 = (VkDevice)0x0;
  local_e8._0_8_ = 0;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_138._16_8_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  createPipelineWithResources
            (deviceInterface,device,local_80,(deUint32)&local_58,&local_78,
             (VkShaderModule *)(ulong)(uint)context->m_targetWidth,context->m_targetHeight,
             (deUint32)(VkDescriptorSetLayoutBinding *)local_e8,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)local_138,local_98,pvStack_90,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,
             (VkPushConstantRange *)0x0,&this->m_resources);
  local_c8 = (VkDescriptorPoolSize *)&local_108;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0x100000003;
  local_e8._0_4_ = 0x21;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)0x100000001;
  VStack_d0.m_internal._0_4_ = 1;
  ::vk::createDescriptorPool
            (&local_158,deviceInterface,device,(VkDescriptorPoolCreateInfo *)local_e8,
             (VkAllocationCallbacks *)0x0);
  pVVar10 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar9 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar7 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar8.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_138._16_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  _uStack_120 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  local_138._0_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_138._8_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal == 0) {
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = pVVar9;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = pVVar10;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = HVar8.m_internal;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = pDVar7;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device
         = (VkDevice)local_138._16_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)_uStack_120;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
         = local_138._0_8_;
    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_138._8_8_;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
    }
  }
  local_38.m_internal =
       (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
       .object.m_internal;
  local_118 = &local_38;
  local_138._0_4_ = 0x22;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  uStack_120 = 1;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&local_158,deviceInterface,device,
             (VkDescriptorSetAllocateInfo *)local_138);
  pVVar10 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
  pVVar9 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  pDVar7 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  HVar8.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
  local_d8 = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
  VStack_d0.m_internal =
       (deUint64)local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
  ;
  local_e8._0_8_ = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar2 = &this->m_descriptorSet;
  dVar6 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
          m_internal;
  if (dVar6 == 0) {
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         pVVar9;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = (deUint64)pVVar10;
    (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         HVar8.m_internal;
    (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface = pDVar7;
  }
  else {
    pDVar7 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = dVar6;
    (*pDVar7->_vptr_DeviceInterface[0x3d])
              (pDVar7,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
    *(VkDescriptorPoolCreateFlags *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device
         = (VkDescriptorPoolCreateFlags)local_d8;
    *(deUint32 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_device + 4) = local_d8._4_4_;
    *(deUint32 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
      m_internal = (deUint32)VStack_d0.m_internal;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_pool.m_internal + 4) = VStack_d0.m_internal._4_4_;
    *(undefined4 *)
     &(pMVar2->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
         local_e8._0_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
             m_internal + 4) = local_e8._4_4_;
    *(undefined4 *)
     &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
      m_deviceIface = local_e8._8_4_;
    *(undefined4 *)
     ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface + 4) = local_e8._12_4_;
    if (local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      local_e8._0_8_ =
           local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
      (*(local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                 m_deviceIface,
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device,
                 local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
                 ,1);
    }
  }
  local_e8._0_4_ = 0xf;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)((ulong)local_d8 & 0xffffffff00000000);
  VStack_d0.m_internal =
       (context->m_context->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
       object.m_internal;
  local_c8 = (VkDescriptorPoolSize *)0x2500000001;
  local_c0 = (Move<vk::Handle<(vk::HandleType)21>_> *)0x400000003;
  local_b8._0_4_ = VK_COMPONENT_SWIZZLE_B;
  local_b8._4_4_ = VK_COMPONENT_SWIZZLE_A;
  VStack_b0.aspectMask = 1;
  VStack_b0.baseMipLevel = 0;
  VStack_b0.levelCount = 1;
  VStack_b0.baseArrayLayer = 0;
  VStack_b0.layerCount = 1;
  ::vk::createImageView
            (&local_108,deviceInterface,device,(VkImageViewCreateInfo *)local_e8,
             (VkAllocationCallbacks *)0x0);
  pVVar10 = local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  pVVar9 = local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  pDVar7 = local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  HVar11.m_internal =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pMVar3 = &this->m_imageView;
  obj_00.m_internal =
       (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         pVVar9;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         pVVar10;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         HVar11.m_internal;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
         = pDVar7;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               obj_00);
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
         = local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface;
    if (local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_108.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
  }
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal = 0;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(local_158.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device.
                _4_4_,context->m_context->m_currentImageLayout);
  local_e8._0_4_ = 0x23;
  local_e8._8_8_ = (DeviceInterface *)0x0;
  local_d8 = (VkDevice)
             (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
  VStack_d0.m_internal = 0;
  local_c8 = (VkDescriptorPoolSize *)0x300000001;
  local_c0 = &local_158;
  local_b8._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_b8._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  VStack_b0.aspectMask = 0;
  VStack_b0.baseMipLevel = 0;
  (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device,1,local_e8,0,0);
  if (local_98 !=
      (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_50,local_58);
  }
  return;
}

Assistant:

void RenderVertexStorageImage::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("storage-image.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
			1,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	{
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
			1
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			1u,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSet = vk::allocateDescriptorSet(vkd, device, &allocateInfo);

		{
			const vk::VkImageViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getImage(),
				vk::VK_IMAGE_VIEW_TYPE_2D,
				vk::VK_FORMAT_R8G8B8A8_UNORM,
				vk::makeComponentMappingRGBA(),
				{
					vk::VK_IMAGE_ASPECT_COLOR_BIT,
					0u,
					1u,
					0u,
					1u
				}
			};

			m_imageView = vk::createImageView(vkd, device, &createInfo);
		}

		{
			const vk::VkDescriptorImageInfo			imageInfo	=
			{
				0,
				*m_imageView,
				context.getImageLayout()
			};
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				*m_descriptorSet,
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
				&imageInfo,
				DE_NULL,
				DE_NULL,
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}